

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

void get_spell_info(wchar_t spell_index,char *p,size_t len)

{
  uint16_t uVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  class_spell_conflict *pcVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  wchar_t rad;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  effect *effect;
  random_value rv;
  char local_b8 [48];
  spell_info_iteration_state ist;
  
  pcVar5 = spell_by_index(player,spell_index);
  effect = pcVar5->effect;
  ist.shared_rv.base = 0;
  ist.shared_rv.dice = 0;
  ist.shared_rv.sides = 0;
  ist.shared_rv.m_bonus = 0;
  ist.pre_rv.base = 0;
  ist.pre_rv.dice = 0;
  ist.pre_rv.sides = 0;
  ist.pre_rv.m_bonus = 0;
  ist.pre_special[0x18] = '\0';
  ist.pre_special[0x19] = '\0';
  ist.pre_special[0x1a] = '\0';
  ist.pre_special[0x1b] = '\0';
  ist.pre_special[0x1c] = '\0';
  ist.pre_special[0x1d] = '\0';
  ist.pre_special[0x1e] = '\0';
  ist.pre_special[0x1f] = '\0';
  ist.pre_special[0x20] = '\0';
  ist.pre_special[0x21] = '\0';
  ist.pre_special[0x22] = '\0';
  ist.pre_special[0x23] = '\0';
  ist.pre_special[0x24] = '\0';
  ist.pre_special[0x25] = '\0';
  ist.pre_special[0x26] = '\0';
  ist.pre_special[0x27] = '\0';
  ist.pre_special[8] = '\0';
  ist.pre_special[9] = '\0';
  ist.pre_special[10] = '\0';
  ist.pre_special[0xb] = '\0';
  ist.pre_special[0xc] = '\0';
  ist.pre_special[0xd] = '\0';
  ist.pre_special[0xe] = '\0';
  ist.pre_special[0xf] = '\0';
  ist.pre_special[0x10] = '\0';
  ist.pre_special[0x11] = '\0';
  ist.pre_special[0x12] = '\0';
  ist.pre_special[0x13] = '\0';
  ist.pre_special[0x14] = '\0';
  ist.pre_special[0x15] = '\0';
  ist.pre_special[0x16] = '\0';
  ist.pre_special[0x17] = '\0';
  ist.pre = (effect *)0x0;
  ist.pre_special[0] = '\0';
  ist.pre_special[1] = '\0';
  ist.pre_special[2] = '\0';
  ist.pre_special[3] = '\0';
  ist.pre_special[4] = '\0';
  ist.pre_special[5] = '\0';
  ist.pre_special[6] = '\0';
  ist.pre_special[7] = '\0';
  ist.have_shared = false;
  ist._81_7_ = 0;
  *p = '\0';
  do {
    if (effect == (effect *)0x0) {
      return;
    }
    rv.base = 0;
    rv.dice = 0;
    rv.sides = 0;
    rv.m_bonus = 0;
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    local_b8[0x1c] = '\0';
    local_b8[0x1d] = '\0';
    local_b8[0x1e] = '\0';
    local_b8[0x1f] = '\0';
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x20] = '\0';
    local_b8[0x21] = '\0';
    local_b8[0x22] = '\0';
    local_b8[0x23] = '\0';
    local_b8[0x24] = '\0';
    local_b8[0x25] = '\0';
    local_b8[0x26] = '\0';
    local_b8[0x27] = '\0';
    sVar6 = strlen(p);
    if (effect->index == 0x6d) {
      if (effect->dice != (dice_t *)0x0) {
        ist.have_shared = true;
        dice_roll(effect->dice,&ist.shared_rv);
      }
    }
    else if (effect->index == 0x6e) {
      ist._80_8_ = (ulong)(uint7)ist._81_7_ << 8;
    }
    pcVar7 = effect_info(effect);
    if (pcVar7 == (char *)0x0) goto LAB_0019f12f;
    if (effect->dice == (dice_t *)0x0) {
      if (ist.have_shared == true) {
        rv.base = ist.shared_rv.base;
        rv.dice = ist.shared_rv.dice;
        rv.sides = ist.shared_rv.sides;
        rv.m_bonus = ist.shared_rv.m_bonus;
      }
    }
    else {
      dice_roll(effect->dice,&rv);
    }
    uVar1 = effect->index;
    switch(uVar1) {
    case 0x46:
      uVar11 = (ulong)(uint)effect->radius;
      if (effect->radius != L'\0') {
LAB_0019ef13:
        pcVar12 = ", rad %d";
        goto LAB_0019ef1d;
      }
      pcVar12 = ", rad 2";
      goto LAB_0019ef3d;
    case 0x47:
      wVar3 = effect->radius;
      uVar11 = (ulong)(uint)wVar3;
      if (wVar3 != L'\0') {
        if (effect->other != L'\0') {
          uVar11 = (ulong)(uint)(wVar3 + (int)player->lev / effect->other);
        }
        goto LAB_0019ef13;
      }
      pcVar12 = "rad 2";
LAB_0019ef3d:
      my_strcpy(local_b8,pcVar12,0x28);
      break;
    case 0x48:
    case 0x49:
    case 0x4b:
      break;
    case 0x4a:
      wVar3 = effect->radius;
      if (effect->other != L'\0') {
        wVar3 = (int)player->lev / effect->other + wVar3;
        if ((int)(uint)z_info->max_range <= wVar3) {
          wVar3 = (wchar_t)z_info->max_range;
        }
      }
      uVar11 = (ulong)(uint)wVar3;
      pcVar12 = ", len %d";
      goto LAB_0019ef1d;
    case 0x4c:
      uVar11 = (ulong)(uint)rv.m_bonus;
      pcVar12 = "x%d";
LAB_0019ef1d:
      strnfmt(local_b8,0x28,pcVar12,uVar11);
      break;
    case 0x4d:
      uVar11 = (ulong)(uint)effect->radius;
      if (effect->radius != L'\0') goto LAB_0019ef13;
      break;
    default:
      if (uVar1 == 0x3a) {
        if (rv.m_bonus != 0) {
          pcVar12 = "random";
          goto LAB_0019ef3d;
        }
      }
      else if ((uVar1 == 3) && (uVar11 = (ulong)(uint)rv.m_bonus, rv.m_bonus != 0)) {
        pcVar12 = "/%d%%";
        goto LAB_0019ef1d;
      }
    }
    iVar2 = rv.base;
    if ((0 < rv.base) || ((0 < rv.dice && (0 < rv.sides)))) {
      if ((ist.pre != (effect *)0x0) &&
         ((((ist.pre)->index == effect->index &&
           (iVar4 = strcmp(local_b8,ist.pre_special), iVar4 == 0)) && (ist.pre_rv.base == iVar2))))
      {
        if (((ist.pre_rv.dice < 1 || ist.pre_rv.sides < 1) && ((rv.dice < 1 || (rv.sides < 1)))) ||
           ((ist.pre_rv.dice == rv.dice && (ist.pre_rv.sides == rv.sides)))) goto LAB_0019f12f;
      }
      if (sVar6 == 0) {
        lVar13 = 0;
      }
      else {
        sVar8 = strnfmt(p + sVar6,len - sVar6,";");
        lVar13 = sVar8 + sVar6;
      }
      sVar8 = strnfmt(p + lVar13,len - lVar13," %s ",pcVar7);
      lVar13 = sVar8 + lVar13;
      pcVar7 = p + lVar13;
      sVar8 = len - lVar13;
      if (rv.base < 1) {
        sVar9 = 0;
LAB_0019f07b:
      }
      else {
        sVar9 = strnfmt(pcVar7,sVar8,"%d");
        if ((0 < rv.dice) && (0 < rv.sides)) {
          sVar10 = strnfmt(pcVar7 + sVar9,sVar8 - sVar9,"+");
          sVar9 = sVar9 + sVar10;
          goto LAB_0019f07b;
        }
      }
      if (rv.dice == 1) {
        if (0 < rv.sides) {
          sVar8 = strnfmt(pcVar7 + sVar9,sVar8 - sVar9,"d%d");
LAB_0019f0ce:
          sVar9 = sVar9 + sVar8;
        }
      }
      else if ((1 < rv.dice) && (0 < rv.sides)) {
        sVar8 = strnfmt(pcVar7 + sVar9,sVar8 - sVar9,"%dd%d");
        goto LAB_0019f0ce;
      }
      sVar6 = strlen(local_b8);
      if (1 < sVar6) {
        strnfmt(p + sVar9 + lVar13,len - (sVar9 + lVar13),"%s",local_b8);
      }
      ist.pre = effect;
      my_strcpy(ist.pre_special,local_b8,0x28);
      ist.pre_rv.base = rv.base;
      ist.pre_rv.dice = rv.dice;
      ist.pre_rv.sides = rv.sides;
      ist.pre_rv.m_bonus = rv.m_bonus;
    }
LAB_0019f12f:
    effect = effect->next;
  } while( true );
}

Assistant:

void get_spell_info(int spell_index, char *p, size_t len)
{
	struct effect *effect = spell_by_index(player, spell_index)->effect;
	struct spell_info_iteration_state ist = {
		NULL, "", { 0, 0, 0, 0 }, { 0, 0, 0, 0 }, false };

	p[0] = '\0';

	while (effect) {
		spell_effect_append_value_info(effect, p, len, &ist);
		effect = effect->next;
	}
}